

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

void __thiscall re2::Prog::Fanout(Prog *this,SparseArray<int> *fanout)

{
  int iVar1;
  Inst *pIVar2;
  bool bVar3;
  IndexValue *pIVar4;
  ostream *poVar5;
  IndexValue *pIVar6;
  _Head_base<0UL,_int_*,_false> _Var7;
  uint uVar8;
  SparseSet reachable;
  SparseSetT<void> local_1d8;
  LogMessage local_1b0;
  
  SparseSetT<void>::SparseSetT(&local_1d8,this->size_);
  fanout->size_ = 0;
  local_1b0.flushed_ = false;
  local_1b0._1_3_ = 0;
  SparseArray<int>::set_new(fanout,this->start_,(int *)&local_1b0);
  pIVar4 = (fanout->dense_).ptr_._M_t.
           super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
  pIVar6 = pIVar4;
  do {
    if (pIVar6 == pIVar4 + fanout->size_) {
      SparseSetT<void>::~SparseSetT(&local_1d8);
      return;
    }
    local_1d8.size_ = 0;
    SparseSetT<void>::insert(&local_1d8,pIVar6->index_);
    for (_Var7._M_head_impl =
              local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
              _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl;
        _Var7._M_head_impl !=
        local_1d8.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl + local_1d8.size_;
        _Var7._M_head_impl = _Var7._M_head_impl + 1) {
      iVar1 = *_Var7._M_head_impl;
      pIVar2 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
      uVar8 = pIVar2[iVar1].out_opcode_;
      switch(uVar8 & 7) {
      case 0:
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
                   ,0x2cf);
        poVar5 = std::operator<<((ostream *)&local_1b0.str_,"unhandled ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,pIVar2[iVar1].out_opcode_ & 7);
        std::operator<<(poVar5," in Prog::Fanout()");
        LogMessage::~LogMessage(&local_1b0);
        break;
      case 1:
switchD_001b001b_caseD_1:
        uVar8 = iVar1 + 1;
        goto LAB_001b0042;
      case 2:
        if ((uVar8 & 8) == 0) {
          SparseSetT<void>::insert(&local_1d8,iVar1 + 1);
        }
        pIVar6->value_ = pIVar6->value_ + 1;
        bVar3 = SparseArray<int>::has_index(fanout,pIVar2[iVar1].out_opcode_ >> 4);
        if (!bVar3) {
          local_1b0.flushed_ = false;
          local_1b0._1_3_ = 0;
          SparseArray<int>::set_new(fanout,pIVar2[iVar1].out_opcode_ >> 4,(int *)&local_1b0);
        }
        break;
      default:
        if ((uVar8 & 8) == 0) {
          SparseSetT<void>::insert(&local_1d8,iVar1 + 1);
          uVar8 = pIVar2[iVar1].out_opcode_;
        }
        uVar8 = uVar8 >> 4;
LAB_001b0042:
        SparseSetT<void>::insert(&local_1d8,uVar8);
        break;
      case 5:
        if ((uVar8 & 8) == 0) goto switchD_001b001b_caseD_1;
        break;
      case 7:
        break;
      }
    }
    pIVar6 = pIVar6 + 1;
    pIVar4 = (fanout->dense_).ptr_._M_t.
             super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
             .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
  } while( true );
}

Assistant:

void Prog::Fanout(SparseArray<int>* fanout) {
  DCHECK_EQ(fanout->max_size(), size());
  SparseSet reachable(size());
  fanout->clear();
  fanout->set_new(start(), 0);
  for (SparseArray<int>::iterator i = fanout->begin(); i != fanout->end(); ++i) {
    int* count = &i->value();
    reachable.clear();
    reachable.insert(i->index());
    for (SparseSet::iterator j = reachable.begin(); j != reachable.end(); ++j) {
      int id = *j;
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled " << ip->opcode() << " in Prog::Fanout()";
          break;

        case kInstByteRange:
          if (!ip->last())
            reachable.insert(id+1);

          (*count)++;
          if (!fanout->has_index(ip->out())) {
            fanout->set_new(ip->out(), 0);
          }
          break;

        case kInstAltMatch:
          DCHECK(!ip->last());
          reachable.insert(id+1);
          break;

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last())
            reachable.insert(id+1);

          reachable.insert(ip->out());
          break;

        case kInstMatch:
          if (!ip->last())
            reachable.insert(id+1);
          break;

        case kInstFail:
          break;
      }
    }
  }
}